

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O1

wchar_t assertion_file_time(char *file,wchar_t line,char *pathname,long t,long nsec,char type,
                           wchar_t recent)

{
  int iVar1;
  time_t tVar2;
  uint uVar3;
  char *__file;
  wchar_t line_00;
  uint uVar5;
  undefined7 in_register_00000089;
  __time_t _Var6;
  char cVar7;
  stat sStack_180;
  char *pcStack_f0;
  ulong uStack_e8;
  char *pcStack_e0;
  long lStack_d8;
  code *pcStack_d0;
  stat st;
  long lVar4;
  stat *__buf;
  char *filename;
  
  assertions = assertions + L'\x01';
  msg = nextmsg;
  nextmsg = (char *)0x0;
  __buf = &st;
  pcStack_d0 = (code *)0x103f21;
  lVar4 = t;
  iVar1 = lstat(pathname,(stat *)__buf);
  line_00 = (wchar_t)__buf;
  uVar3 = (uint)lVar4;
  if (iVar1 == 0) {
    cVar7 = (char)(nsec & 0xffffffffU);
    uVar5 = (uint)cVar7;
    filename = (char *)(ulong)uVar5;
    _Var6 = st.st_mtim.tv_sec;
    if (uVar5 != 0x6d) {
      if (uVar5 == 0x62) {
        _Var6 = 0;
      }
      else {
        _Var6 = st.st_atim.tv_sec;
        if (uVar5 != 0x61) {
          pcStack_d0 = assertion_file_mode;
          assertion_file_time_cold_1();
          assertions = assertions + L'\x01';
          msg = nextmsg;
          nextmsg = (char *)0x0;
          pcStack_f0 = pathname;
          uStack_e8 = nsec & 0xffffffffU;
          pcStack_e0 = file;
          lStack_d8 = t;
          pcStack_d0 = (code *)(ulong)(uint)line;
          iVar1 = lstat(__file,&sStack_180);
          uVar5 = sStack_180.st_mode & 0x1ff;
          if (uVar5 != uVar3 || iVar1 != 0) {
            failure_start(filename,line_00,"File %s has mode %o, expected %o",__file,(ulong)uVar5,
                          (ulong)uVar3);
            failure_finish(filename);
          }
          return (uint)(uVar5 == uVar3 && iVar1 == 0);
        }
      }
    }
    if (cVar7 == 'b') {
      return L'\x01';
    }
    if ((int)CONCAT71(in_register_00000089,type) == 0) {
      if (_Var6 == t) {
        return L'\x01';
      }
      lStack_d8 = 0;
      uStack_e8 = 0;
      pcStack_f0 = (char *)0x104026;
      pcStack_e0 = (char *)t;
      failure_start(file,line,"File %s has %ctime %lld.%09lld, expected %ld.%09ld",pathname,
                    (ulong)uVar5);
    }
    else {
      pcStack_d0 = (code *)0x103f97;
      tVar2 = time((time_t *)0x0);
      if (_Var6 <= tVar2 + 1 && tVar2 + -10 <= _Var6) {
        return L'\x01';
      }
      lStack_d8 = tVar2 - _Var6;
      pcStack_e0 = (char *)0x103fda;
      failure_start(file,line,"File %s has %ctime %lld, %lld seconds ago\n",pathname,(ulong)uVar5,
                    _Var6);
    }
  }
  else {
    pcStack_d0 = (code *)0x103f3b;
    failure_start(file,line,"Can\'t stat %s\n",pathname);
  }
  pcStack_d0 = (code *)0x103f40;
  failure_finish(file);
  return L'\0';
}

Assistant:

static int
assertion_file_time(const char *file, int line,
    const char *pathname, long t, long nsec, char type, int recent)
{
	long long filet, filet_nsec;
	int r;

#if defined(_WIN32) && !defined(__CYGWIN__)
#define EPOC_TIME	(116444736000000000ULL)
	FILETIME fxtime, fbirthtime, fatime, fmtime;
	ULARGE_INTEGER wintm;
	HANDLE h;
	fxtime.dwLowDateTime = 0;
	fxtime.dwHighDateTime = 0;

	assertion_count(file, line);
	/* Note: FILE_FLAG_BACKUP_SEMANTICS applies to open
	 * a directory file. If not, CreateFile() will fail when
	 * the pathname is a directory. */
	h = CreateFileA(pathname, FILE_READ_ATTRIBUTES, 0, NULL,
	    OPEN_EXISTING, FILE_FLAG_BACKUP_SEMANTICS, NULL);
	if (h == INVALID_HANDLE_VALUE) {
		failure_start(file, line, "Can't access %s\n", pathname);
		failure_finish(NULL);
		return (0);
	}
	r = GetFileTime(h, &fbirthtime, &fatime, &fmtime);
	switch (type) {
	case 'a': fxtime = fatime; break;
	case 'b': fxtime = fbirthtime; break;
	case 'm': fxtime = fmtime; break;
	}
	CloseHandle(h);
	if (r == 0) {
		failure_start(file, line, "Can't GetFileTime %s\n", pathname);
		failure_finish(NULL);
		return (0);
	}
	wintm.LowPart = fxtime.dwLowDateTime;
	wintm.HighPart = fxtime.dwHighDateTime;
	filet = (wintm.QuadPart - EPOC_TIME) / 10000000;
	filet_nsec = ((wintm.QuadPart - EPOC_TIME) % 10000000) * 100;
	nsec = (nsec / 100) * 100; /* Round the request */
#else
	struct stat st;

	assertion_count(file, line);
	r = lstat(pathname, &st);
	if (r != 0) {
		failure_start(file, line, "Can't stat %s\n", pathname);
		failure_finish(NULL);
		return (0);
	}
	switch (type) {
	case 'a': filet = st.st_atime; break;
	case 'm': filet = st.st_mtime; break;
	case 'b': filet = 0; break;
	default: fprintf(stderr, "INTERNAL: Bad type %c for file time", type);
		exit(1);
	}
#if defined(__FreeBSD__)
	switch (type) {
	case 'a': filet_nsec = st.st_atimespec.tv_nsec; break;
	case 'b': filet = st.st_birthtime;
		/* FreeBSD filesystems that don't support birthtime
		 * (e.g., UFS1) always return -1 here. */
		if (filet == -1) {
			return (1);
		}
		filet_nsec = st.st_birthtimespec.tv_nsec; break;
	case 'm': filet_nsec = st.st_mtimespec.tv_nsec; break;
	default: fprintf(stderr, "INTERNAL: Bad type %c for file time", type);
		exit(1);
	}
	/* FreeBSD generally only stores to microsecond res, so round. */
	filet_nsec = (filet_nsec / 1000) * 1000;
	nsec = (nsec / 1000) * 1000;
#else
	filet_nsec = nsec = 0;	/* Generic POSIX only has whole seconds. */
	if (type == 'b') return (1); /* Generic POSIX doesn't have birthtime */
#if defined(__HAIKU__)
	if (type == 'a') return (1); /* Haiku doesn't have atime. */
#endif
#endif
#endif
	if (recent) {
		/* Check that requested time is up-to-date. */
		time_t now = time(NULL);
		if (filet < now - 10 || filet > now + 1) {
			failure_start(file, line,
			    "File %s has %ctime %lld, %lld seconds ago\n",
			    pathname, type, filet, now - filet);
			failure_finish(NULL);
			return (0);
		}
	} else if (filet != t || filet_nsec != nsec) {
		failure_start(file, line,
		    "File %s has %ctime %lld.%09lld, expected %ld.%09ld",
		    pathname, type, filet, filet_nsec, t, nsec);
		failure_finish(NULL);
		return (0);
	}
	return (1);
}